

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_policy_testing.h
# Opt level: O2

void __thiscall phmap::priv::NonStandardLayout::~NonStandardLayout(NonStandardLayout *this)

{
  ~NonStandardLayout(this);
  operator_delete(this,0x28);
  return;
}

Assistant:

virtual ~NonStandardLayout() {}